

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
b_array::
Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~Array(Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this)

{
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  
  pPVar1 = this->data;
  if (pPVar1 != (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    lVar4 = *(long *)((long)&pPVar1[-1].value.field_2 + 8);
    if (lVar4 != 0) {
      paVar3 = &pPVar1[lVar4 + -1].value.field_2;
      lVar4 = lVar4 * -0x28;
      do {
        pcVar2 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar3 + -0x28);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
    }
    operator_delete__((void *)((long)&pPVar1[-1].value.field_2 + 8));
    return;
  }
  return;
}

Assistant:

~Array() { delete[] data; }